

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode_utils_basis.h
# Opt level: O0

void __thiscall ktx::OptionsEncodeBasis<true>::OptionsEncodeBasis(OptionsEncodeBasis<true> *this)

{
  uint *puVar1;
  undefined4 *in_RDI;
  int i;
  int local_20;
  uint local_10 [4];
  
  ClampedOption<unsigned_int>::ClampedOption
            ((ClampedOption<unsigned_int> *)(in_RDI + 0x14),in_RDI + 4,1,0xff);
  ClampedOption<unsigned_int>::ClampedOption
            ((ClampedOption<unsigned_int> *)(in_RDI + 0x18),in_RDI + 5,1,0x3f00);
  ClampedOption<unsigned_int>::ClampedOption
            ((ClampedOption<unsigned_int> *)(in_RDI + 0x1c),in_RDI + 7,1,0x3f00);
  ClampedOption<unsigned_int>::ClampedOption
            ((ClampedOption<unsigned_int> *)(in_RDI + 0x20),in_RDI + 0xf,0x100,0x10000);
  ClampedOption<float>::ClampedOption
            ((ClampedOption<float> *)(in_RDI + 0x24),(float *)(in_RDI + 0xe),0.001,50.0);
  ClampedOption<float>::ClampedOption
            ((ClampedOption<float> *)(in_RDI + 0x28),(float *)(in_RDI + 0x10),1.0,300.0);
  ClampedOption<float>::ClampedOption
            ((ClampedOption<float> *)(in_RDI + 0x2c),(float *)(in_RDI + 0x11),0.01,65536.0);
  std::__cxx11::string::string((string *)(in_RDI + 0x30));
  std::__cxx11::string::string((string *)(in_RDI + 0x38));
  local_10[1] = 1;
  local_10[0] = std::thread::hardware_concurrency();
  puVar1 = std::max<unsigned_int>(local_10 + 1,local_10);
  in_RDI[2] = *puVar1;
  *(undefined1 *)((long)in_RDI + 6) = 0;
  *in_RDI = 0x4c;
  in_RDI[3] = _KTX_ETC1S_DEFAULT_COMPRESSION_LEVEL + -1;
  ClampedOption<unsigned_int>::clear((ClampedOption<unsigned_int> *)(in_RDI + 0x14));
  ClampedOption<unsigned_int>::clear((ClampedOption<unsigned_int> *)(in_RDI + 0x18));
  in_RDI[6] = 0;
  ClampedOption<unsigned_int>::clear((ClampedOption<unsigned_int> *)(in_RDI + 0x1c));
  in_RDI[8] = 0;
  *(undefined1 *)(in_RDI + 10) = 0;
  *(undefined1 *)((long)in_RDI + 0x29) = 0;
  *(undefined1 *)((long)in_RDI + 0x2a) = 0;
  *(undefined1 *)((long)in_RDI + 0x2b) = 0;
  *(undefined1 *)(in_RDI + 0xb) = 0;
  *(undefined1 *)(in_RDI + 1) = 0;
  *(undefined1 *)(in_RDI + 0xd) = 0;
  in_RDI[0xc] = 2;
  ClampedOption<unsigned_int>::clear((ClampedOption<unsigned_int> *)(in_RDI + 0x20));
  ClampedOption<float>::clear((ClampedOption<float> *)(in_RDI + 0x24));
  *(undefined1 *)(in_RDI + 0x12) = 0;
  *(undefined1 *)((long)in_RDI + 0x49) = 0;
  *(undefined1 *)((long)in_RDI + 5) = 0;
  for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
    *(undefined1 *)((long)in_RDI + (long)local_20 + 0x24) = 0;
  }
  return;
}

Assistant:

OptionsEncodeBasis() :
        qualityLevel(ktxBasisParams::qualityLevel, 1, 255),
        maxEndpoints(ktxBasisParams::maxEndpoints, 1, 16128),
        maxSelectors(ktxBasisParams::maxSelectors, 1, 16128),
        uastcRDODictSize(ktxBasisParams::uastcRDODictSize, 256, 65536),
        uastcRDOQualityScalar(ktxBasisParams::uastcRDOQualityScalar,
                              0.001f, 50.0f),
        uastcRDOMaxSmoothBlockErrorScale(
            ktxBasisParams::uastcRDOMaxSmoothBlockErrorScale,
            1.0f, 300.0f),
        uastcRDOMaxSmoothBlockStdDev(
            ktxBasisParams::uastcRDOMaxSmoothBlockStdDev,
            0.01f, 65536.0f) {
        threadCount = std::max<ktx_uint32_t>(1u, std::thread::hardware_concurrency());
        noSSE = false;
        structSize = sizeof(ktxBasisParams);
        // - 1 is to match what basisu_tool does (since 1.13).
        compressionLevel = KTX_ETC1S_DEFAULT_COMPRESSION_LEVEL - 1;
        qualityLevel.clear();
        maxEndpoints.clear();
        endpointRDOThreshold = 0.0f;
        maxSelectors.clear();
        selectorRDOThreshold = 0.0f;
        normalMap = false;
        separateRGToRGB_A = false;
        preSwizzle = false;
        noEndpointRDO = false;
        noSelectorRDO = false;
        uastc = false; // Default to ETC1S.
        uastcRDO = false;
        uastcFlags = KTX_PACK_UASTC_LEVEL_DEFAULT;
        uastcRDODictSize.clear();
        uastcRDOQualityScalar.clear();
        uastcRDODontFavorSimplerModes = false;
        uastcRDONoMultithreading = false;
        verbose = false; // Default to quiet operation.
        for (int i = 0; i < 4; i++) inputSwizzle[i] = 0;
    }